

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O1

void __thiscall
soplex::SPxSolverBase<double>::getEnterVals
          (SPxSolverBase<double> *this,SPxId enterId,double *enterTest,double *enterUB,
          double *enterLB,double *enterVal,double *enterMax,double *enterPric,Status *enterStat,
          double *enterRO,StableSum<double> *objChange)

{
  double dVar1;
  Real RVar2;
  double dVar3;
  int iVar4;
  Status SVar5;
  double *pdVar6;
  Status *pSVar7;
  pointer pdVar8;
  undefined8 *puVar9;
  VectorBase<double> *pVVar10;
  long lVar11;
  long in_FS_OFFSET;
  ulong uVar12;
  undefined4 uVar13;
  uint uVar14;
  double dVar15;
  double dVar16;
  uint uStack_64;
  DataKey local_58;
  long local_50;
  undefined1 local_48 [16];
  DataKey local_38;
  
  local_38 = enterId.super_DataKey;
  if (enterId.super_DataKey.info < 1) {
    SPxRowId::SPxRowId((SPxRowId *)&local_58,(SPxId *)&local_38);
    iVar4 = ClassSet<soplex::SVSetBase<double>::DLPSV>::number
                      (&(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                        super_SVSetBase<double>.set,&local_58);
    lVar11 = (long)iVar4;
    *enterStat = (this->super_SPxBasisBase<double>).thedesc.rowstat.data[lVar11];
    if (this->theRep == ROW) {
      computePvec(this,iVar4);
      dVar1 = computeTest(this,iVar4);
      *enterTest = dVar1;
      pdVar6 = (this->theTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + lVar11;
    }
    else {
      pdVar6 = (this->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + lVar11;
      *enterTest = *pdVar6;
    }
    *pdVar6 = 0.0;
    switch(*enterStat) {
    case D_FREE:
      ::soplex::infinity::__tls_init();
      dVar1 = *(double *)(in_FS_OFFSET + -8);
      *enterUB = dVar1;
      ::soplex::infinity::__tls_init();
      *enterLB = -dVar1;
      *enterVal = 0.0;
      *enterPric = (this->thePvec->super_VectorBase<double>).val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar11];
      dVar3 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar11];
      *enterRO = dVar3;
      uVar12 = -(ulong)(dVar3 < *enterPric);
      ::soplex::infinity::__tls_init();
      *enterMax = (double)(~uVar12 & (ulong)-dVar1 | (ulong)dVar1 & uVar12);
      pSVar7 = (this->super_SPxBasisBase<double>).thedesc.rowstat.data;
      goto LAB_001c2110;
    case D_ON_UPPER:
      *enterUB = (this->theURbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar11];
      ::soplex::infinity::__tls_init();
      uVar13 = (undefined4)*(undefined8 *)(in_FS_OFFSET + -8);
      uStack_64 = (uint)((ulong)*(undefined8 *)(in_FS_OFFSET + -8) >> 0x20);
      *(undefined4 *)enterLB = uVar13;
      *(uint *)((long)enterLB + 4) = uStack_64 ^ 0x80000000;
      *enterVal = *enterUB;
      uStack_64 = uStack_64 ^ 0x80000000;
      ::soplex::infinity::__tls_init();
      *(undefined4 *)enterMax = uVar13;
      *(uint *)((long)enterMax + 4) = uStack_64;
      *enterPric = (this->thePvec->super_VectorBase<double>).val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar11];
      dVar1 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar11];
      *enterRO = dVar1;
      dVar1 = dVar1 * *enterVal;
      dVar3 = objChange->sum;
      dVar15 = dVar3 - dVar1;
      objChange->c = (-dVar1 - (dVar15 - dVar3)) + (dVar3 - (dVar15 - (dVar15 - dVar3))) +
                     objChange->c;
      objChange->sum = dVar15;
      pSVar7 = (this->super_SPxBasisBase<double>).thedesc.rowstat.data;
      goto LAB_001c2508;
    case D_ON_LOWER:
      *enterLB = (this->theLRbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar11];
      ::soplex::infinity::__tls_init();
      dVar1 = *(double *)(in_FS_OFFSET + -8);
      *enterUB = dVar1;
      *enterVal = *enterLB;
      ::soplex::infinity::__tls_init();
      *enterMax = dVar1;
      *enterPric = (this->thePvec->super_VectorBase<double>).val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar11];
      dVar1 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar11];
      *enterRO = dVar1;
      dVar1 = dVar1 * *enterVal;
      dVar3 = objChange->sum;
      dVar15 = dVar3 - dVar1;
      objChange->c = (-dVar1 - (dVar15 - dVar3)) + (dVar3 - (dVar15 - (dVar15 - dVar3))) +
                     objChange->c;
      objChange->sum = dVar15;
      pSVar7 = (this->super_SPxBasisBase<double>).thedesc.rowstat.data;
      goto LAB_001c2353;
    case D_ON_BOTH:
      dVar1 = (this->thePvec->super_VectorBase<double>).val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar11];
      *enterPric = dVar1;
      pdVar6 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start + lVar11;
      if (dVar1 < *pdVar6 || dVar1 == *pdVar6) {
        dVar1 = (this->theURbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar11];
        *enterUB = dVar1;
        *enterVal = dVar1;
        ::soplex::infinity::__tls_init();
        dVar1 = *(double *)(in_FS_OFFSET + -8);
        *enterLB = -dVar1;
        ::soplex::infinity::__tls_init();
        *enterMax = -dVar1;
        pVVar10 = &(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.left;
        SVar5 = P_ON_LOWER;
      }
      else {
        dVar1 = (this->theLRbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar11];
        *enterLB = dVar1;
        *enterVal = dVar1;
        ::soplex::infinity::__tls_init();
        dVar1 = *(double *)(in_FS_OFFSET + -8);
        *enterUB = dVar1;
        ::soplex::infinity::__tls_init();
        pVVar10 = &(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.right;
        *enterMax = dVar1;
        SVar5 = P_ON_UPPER;
      }
      *enterRO = (pVVar10->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar11];
      (this->super_SPxBasisBase<double>).thedesc.rowstat.data[lVar11] = SVar5;
      dVar3 = (this->theLRbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar11] *
              (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar11];
      dVar1 = objChange->sum;
      dVar15 = dVar1 - dVar3;
      dVar3 = (-dVar3 - (dVar15 - dVar1)) + (dVar1 - (dVar15 - (dVar15 - dVar1))) + objChange->c;
      objChange->c = dVar3;
      objChange->sum = dVar15;
      dVar1 = (this->theURbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar11];
      pdVar8 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      goto LAB_001c277e;
    case P_ON_LOWER:
      *enterUB = (this->theURbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar11];
      *enterLB = (this->theLRbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar11];
      *enterVal = *enterUB;
      *enterMax = *enterLB - *enterUB;
      *enterPric = (this->theCoPvec->super_VectorBase<double>).val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar11];
      dVar1 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.object.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar11];
      *enterRO = dVar1;
      dVar1 = dVar1 * *enterVal;
      dVar3 = objChange->sum;
      dVar15 = dVar3 - dVar1;
      objChange->c = (-dVar1 - (dVar15 - dVar3)) + (dVar3 - (dVar15 - (dVar15 - dVar3))) +
                     objChange->c;
      objChange->sum = dVar15;
      dVar1 = *enterLB;
      ::soplex::infinity::__tls_init();
      if (dVar1 <= -*(double *)(in_FS_OFFSET + -8)) {
        pSVar7 = (this->super_SPxBasisBase<double>).thedesc.rowstat.data;
        goto LAB_001c1abd;
      }
      break;
    default:
      puVar9 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_58 = (DataKey)local_48;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,"XENTER03 This should never happen.","");
      *puVar9 = &PTR__SPxException_006a9ee8;
      puVar9[1] = puVar9 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar9 + 1),local_58,(undefined1 *)(local_50 + (long)local_58));
      *puVar9 = &PTR__SPxException_006a9ec0;
      __cxa_throw(puVar9,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    case P_ON_UPPER:
      *enterUB = (this->theURbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar11];
      dVar1 = (this->theLRbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar11];
      *enterLB = dVar1;
      *enterVal = dVar1;
      *enterMax = *enterUB - *enterLB;
      *enterPric = (this->theCoPvec->super_VectorBase<double>).val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar11];
      dVar1 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.object.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar11];
      *enterRO = dVar1;
      dVar1 = dVar1 * *enterVal;
      dVar3 = objChange->sum;
      dVar15 = dVar3 - dVar1;
      objChange->c = (-dVar1 - (dVar15 - dVar3)) + (dVar3 - (dVar15 - (dVar15 - dVar3))) +
                     objChange->c;
      objChange->sum = dVar15;
      dVar1 = *enterUB;
      ::soplex::infinity::__tls_init();
      if (*(double *)(in_FS_OFFSET + -8) <= dVar1) {
        pSVar7 = (this->super_SPxBasisBase<double>).thedesc.rowstat.data;
        goto LAB_001c266a;
      }
      break;
    case P_FREE:
      puVar9 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_58 = (DataKey)local_48;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,"XENTER02 This should never happen.","");
      *puVar9 = &PTR__SPxException_006a9ee8;
      puVar9[1] = puVar9 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar9 + 1),local_58,(undefined1 *)(local_50 + (long)local_58));
      *puVar9 = &PTR__SPxException_006a9ec0;
      __cxa_throw(puVar9,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    }
    dVar1 = *enterLB;
    dVar3 = *enterUB;
    RVar2 = Tolerances::epsilon((this->super_SPxLPBase<double>)._tolerances.
                                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr);
    pSVar7 = (this->super_SPxBasisBase<double>).thedesc.rowstat.data;
    if (ABS(dVar1 - dVar3) <= RVar2) goto LAB_001c224e;
  }
  else {
    SPxColId::SPxColId((SPxColId *)&local_58,(SPxId *)&local_38);
    iVar4 = ClassSet<soplex::SVSetBase<double>::DLPSV>::number
                      (&(this->super_SPxLPBase<double>).super_LPColSetBase<double>.
                        super_SVSetBase<double>.set,&local_58);
    lVar11 = (long)iVar4;
    *enterStat = (this->super_SPxBasisBase<double>).thedesc.colstat.data[lVar11];
    if (this->theRep == COLUMN) {
      computePvec(this,iVar4);
      dVar1 = computeTest(this,iVar4);
      *enterTest = dVar1;
      pdVar6 = (this->theTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + lVar11;
    }
    else {
      pdVar6 = (this->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + lVar11;
      *enterTest = *pdVar6;
    }
    *pdVar6 = 0.0;
    switch(*enterStat) {
    case D_FREE:
      ::soplex::infinity::__tls_init();
      dVar1 = *(double *)(in_FS_OFFSET + -8);
      *enterUB = dVar1;
      ::soplex::infinity::__tls_init();
      *enterLB = -dVar1;
      *enterVal = 0.0;
      *enterRO = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar11];
      dVar3 = (this->theCoPvec->super_VectorBase<double>).val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar11];
      *enterPric = dVar3;
      uVar12 = -(ulong)(*enterRO < dVar3);
      ::soplex::infinity::__tls_init();
      *enterMax = (double)(~uVar12 & (ulong)-dVar1 | (ulong)dVar1 & uVar12);
      pSVar7 = (this->super_SPxBasisBase<double>).thedesc.colstat.data;
LAB_001c2110:
      pSVar7[lVar11] = P_FIXED;
      return;
    case D_ON_UPPER:
      *enterUB = (this->theUCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar11];
      ::soplex::infinity::__tls_init();
      dVar1 = *(double *)(in_FS_OFFSET + -8);
      *enterLB = -dVar1;
      ::soplex::infinity::__tls_init();
      *enterMax = -dVar1;
      *enterVal = *enterUB;
      *enterPric = (this->theCoPvec->super_VectorBase<double>).val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar11];
      dVar1 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar11];
      *enterRO = dVar1;
      dVar1 = dVar1 * *enterVal;
      dVar3 = objChange->sum;
      dVar15 = dVar3 - dVar1;
      objChange->c = (-dVar1 - (dVar15 - dVar3)) + (dVar3 - (dVar15 - (dVar15 - dVar3))) +
                     objChange->c;
      objChange->sum = dVar15;
      pSVar7 = (this->super_SPxBasisBase<double>).thedesc.colstat.data;
LAB_001c2508:
      pSVar7[lVar11] = P_ON_LOWER;
      return;
    case D_ON_LOWER:
      *enterLB = (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar11];
      ::soplex::infinity::__tls_init();
      dVar1 = *(double *)(in_FS_OFFSET + -8);
      *enterUB = dVar1;
      ::soplex::infinity::__tls_init();
      *enterMax = dVar1;
      *enterVal = *enterLB;
      *enterPric = (this->theCoPvec->super_VectorBase<double>).val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar11];
      dVar1 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar11];
      *enterRO = dVar1;
      dVar1 = dVar1 * *enterVal;
      dVar3 = objChange->sum;
      dVar15 = dVar3 - dVar1;
      objChange->c = (-dVar1 - (dVar15 - dVar3)) + (dVar3 - (dVar15 - (dVar15 - dVar3))) +
                     objChange->c;
      objChange->sum = dVar15;
      pSVar7 = (this->super_SPxBasisBase<double>).thedesc.colstat.data;
LAB_001c2353:
      pSVar7[lVar11] = P_ON_UPPER;
      return;
    case D_ON_BOTH:
      dVar1 = (this->theCoPvec->super_VectorBase<double>).val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar11];
      *enterPric = dVar1;
      pdVar6 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start + lVar11;
      if (dVar1 < *pdVar6 || dVar1 == *pdVar6) {
        dVar1 = (this->theUCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar11];
        *enterUB = dVar1;
        *enterVal = dVar1;
        *enterRO = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar11];
        ::soplex::infinity::__tls_init();
        dVar1 = *(double *)(in_FS_OFFSET + -8);
        *enterLB = -dVar1;
        ::soplex::infinity::__tls_init();
        *enterMax = -dVar1;
        SVar5 = P_ON_LOWER;
      }
      else {
        *enterLB = (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start[lVar11];
        ::soplex::infinity::__tls_init();
        dVar1 = *(double *)(in_FS_OFFSET + -8);
        *enterUB = dVar1;
        ::soplex::infinity::__tls_init();
        *enterMax = dVar1;
        *enterVal = *enterLB;
        *enterRO = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar11];
        SVar5 = P_ON_UPPER;
      }
      (this->super_SPxBasisBase<double>).thedesc.colstat.data[lVar11] = SVar5;
      dVar3 = (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar11] *
              (this->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar11];
      dVar1 = objChange->sum;
      dVar15 = dVar1 - dVar3;
      dVar3 = (-dVar3 - (dVar15 - dVar1)) + (dVar1 - (dVar15 - (dVar15 - dVar1))) + objChange->c;
      objChange->c = dVar3;
      objChange->sum = dVar15;
      dVar1 = (this->theUCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar11];
      pdVar8 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
LAB_001c277e:
      dVar16 = dVar15 - dVar1 * pdVar8[lVar11];
      objChange->c = (-(dVar1 * pdVar8[lVar11]) - (dVar16 - dVar15)) +
                     (dVar15 - (dVar16 - (dVar16 - dVar15))) + dVar3;
      objChange->sum = dVar16;
      return;
    case P_ON_LOWER:
      *enterUB = (this->theUCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar11];
      dVar1 = (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar11];
      *enterLB = dVar1;
      *enterVal = dVar1;
      *enterMax = *enterUB - *enterLB;
      *enterPric = (this->thePvec->super_VectorBase<double>).val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar11];
      dVar1 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.object.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar11];
      *enterRO = dVar1;
      dVar1 = dVar1 * *enterVal;
      dVar3 = objChange->sum;
      dVar15 = dVar3 - dVar1;
      objChange->c = (-dVar1 - (dVar15 - dVar3)) + (dVar3 - (dVar15 - (dVar15 - dVar3))) +
                     objChange->c;
      objChange->sum = dVar15;
      dVar1 = *enterUB;
      ::soplex::infinity::__tls_init();
      if (*(double *)(in_FS_OFFSET + -8) <= dVar1) {
        pSVar7 = (this->super_SPxBasisBase<double>).thedesc.colstat.data;
LAB_001c1abd:
        pSVar7[lVar11] = D_ON_UPPER;
        return;
      }
      break;
    default:
      puVar9 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_58 = (DataKey)local_48;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,"XENTER01 This should never happen.","");
      *puVar9 = &PTR__SPxException_006a9ee8;
      puVar9[1] = puVar9 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar9 + 1),local_58,(undefined1 *)(local_50 + (long)local_58));
      *puVar9 = &PTR__SPxException_006a9ec0;
      __cxa_throw(puVar9,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    case P_ON_UPPER:
      *enterUB = (this->theUCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar11];
      *enterLB = (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar11];
      *enterVal = *enterUB;
      *enterMax = *enterLB - *enterUB;
      *enterPric = (this->thePvec->super_VectorBase<double>).val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar11];
      dVar1 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.object.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar11];
      *enterRO = dVar1;
      dVar1 = dVar1 * *enterVal;
      dVar3 = objChange->sum;
      dVar15 = dVar3 - dVar1;
      objChange->c = (-dVar1 - (dVar15 - dVar3)) + (dVar3 - (dVar15 - (dVar15 - dVar3))) +
                     objChange->c;
      objChange->sum = dVar15;
      dVar1 = *enterLB;
      ::soplex::infinity::__tls_init();
      if (dVar1 <= -*(double *)(in_FS_OFFSET + -8)) {
        pSVar7 = (this->super_SPxBasisBase<double>).thedesc.colstat.data;
LAB_001c266a:
        pSVar7[lVar11] = D_ON_LOWER;
        return;
      }
      break;
    case P_FREE:
      *enterUB = (this->theUCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar11];
      *enterLB = (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar11];
      *enterVal = 0.0;
      *enterPric = (this->thePvec->super_VectorBase<double>).val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar11];
      dVar1 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.object.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar11];
      *enterRO = dVar1;
      (this->super_SPxBasisBase<double>).thedesc.colstat.data[lVar11] = D_UNDEFINED;
      if (dVar1 < *enterPric || dVar1 == *enterPric) {
        ::soplex::infinity::__tls_init();
        uVar14 = (uint)((ulong)*(undefined8 *)(in_FS_OFFSET + -8) >> 0x20) ^ 0x80000000;
        uVar13 = (undefined4)*(undefined8 *)(in_FS_OFFSET + -8);
      }
      else {
        ::soplex::infinity::__tls_init();
        uVar13 = (undefined4)*(undefined8 *)(in_FS_OFFSET + -8);
        uVar14 = (uint)((ulong)*(undefined8 *)(in_FS_OFFSET + -8) >> 0x20);
      }
      *enterMax = (double)CONCAT44(uVar14,uVar13);
      return;
    }
    dVar1 = *enterLB;
    dVar3 = *enterUB;
    RVar2 = Tolerances::epsilon((this->super_SPxLPBase<double>)._tolerances.
                                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr);
    pSVar7 = (this->super_SPxBasisBase<double>).thedesc.colstat.data;
    if (ABS(dVar1 - dVar3) <= RVar2) {
LAB_001c224e:
      pSVar7[lVar11] = D_FREE;
      return;
    }
  }
  pSVar7[lVar11] = D_ON_BOTH;
  return;
}

Assistant:

void SPxSolverBase<R>::getEnterVals
(
   SPxId enterId,
   R& enterTest,
   R& enterUB,
   R& enterLB,
   R& enterVal,
   R& enterMax,
   R& enterPric,
   typename SPxBasisBase<R>::Desc::Status& enterStat,
   R& enterRO,
   StableSum<R>& objChange
)
{
   int enterIdx;
   typename SPxBasisBase<R>::Desc& ds = this->desc();

   if(enterId.isSPxColId())
   {
      enterIdx = this->number(SPxColId(enterId));
      enterStat = ds.colStatus(enterIdx);
      assert(!isBasic(enterStat));

      /*      For an #Id# to enter the basis we better recompute the Test value.
       */
      if(rep() == COLUMN)
      {
         computePvec(enterIdx);
         enterTest = computeTest(enterIdx);
         theTest[enterIdx] = 0;
      }
      else
      {
         enterTest = coTest()[enterIdx];
         theCoTest[enterIdx] = 0;
      }

      switch(enterStat)
      {
      // primal/columnwise cases:
      case SPxBasisBase<R>::Desc::P_ON_UPPER :
         assert(rep() == COLUMN);
         enterUB = theUCbound[enterIdx];
         enterLB = theLCbound[enterIdx];
         enterVal = enterUB;
         enterMax = enterLB - enterUB;
         enterPric = (*thePvec)[enterIdx];
         enterRO = this->maxObj(enterIdx);
         objChange -= enterVal * enterRO;

         if(enterLB <= R(-infinity))
            ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::D_ON_LOWER;
         else if(EQ(enterLB, enterUB, this->epsilon()))
            ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::D_FREE;
         else
            ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::D_ON_BOTH;

         break;

      case SPxBasisBase<R>::Desc::P_ON_LOWER :
         assert(rep() == COLUMN);
         enterUB = theUCbound[enterIdx];
         enterLB = theLCbound[enterIdx];
         enterVal = enterLB;
         enterMax = enterUB - enterLB;
         enterPric = (*thePvec)[enterIdx];
         enterRO = this->maxObj(enterIdx);
         objChange -= enterVal * enterRO;

         if(enterUB >= R(infinity))
            ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::D_ON_UPPER;
         else if(EQ(enterLB, enterUB, this->epsilon()))
            ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::D_FREE;
         else
            ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::D_ON_BOTH;

         break;

      case SPxBasisBase<R>::Desc::P_FREE :
         assert(rep() == COLUMN);
         enterUB = theUCbound[enterIdx];
         enterLB = theLCbound[enterIdx];
         enterVal = 0;
         enterPric = (*thePvec)[enterIdx];
         enterRO = this->maxObj(enterIdx);
         ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::D_UNDEFINED;
         enterMax = (enterRO - enterPric > 0) ? R(infinity) : R(-infinity);
         break;

      // dual/rowwise cases:
      case SPxBasisBase<R>::Desc::D_ON_UPPER :
         assert(rep() == ROW);
         assert(theUCbound[enterIdx] < R(infinity));
         enterUB = theUCbound[enterIdx];
         enterLB = R(-infinity);
         enterMax = R(-infinity);
         enterVal = enterUB;
         enterPric = (*theCoPvec)[enterIdx];
         enterRO = SPxLPBase<R>::lower(enterIdx);
         objChange -= enterRO * enterVal;
         ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         break;

      case SPxBasisBase<R>::Desc::D_ON_LOWER :
         assert(rep() == ROW);
         assert(theLCbound[enterIdx] > R(-infinity));
         enterLB = theLCbound[enterIdx];
         enterUB = R(infinity);
         enterMax = R(infinity);
         enterVal = enterLB;
         enterPric = (*theCoPvec)[enterIdx];
         enterRO = SPxLPBase<R>::upper(enterIdx);
         objChange -= enterRO * enterVal;
         ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         break;

      case SPxBasisBase<R>::Desc::D_FREE:
         assert(rep() == ROW);
         assert(SPxLPBase<R>::lower(enterIdx) == SPxLPBase<R>::upper(enterIdx));
         enterUB = R(infinity);
         enterLB = R(-infinity);
         enterVal = 0;
         enterRO = SPxLPBase<R>::upper(enterIdx);
         enterPric = (*theCoPvec)[enterIdx];

         if(enterPric > enterRO)
            enterMax = R(infinity);
         else
            enterMax = R(-infinity);

         ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::P_FIXED;
         break;

      case SPxBasisBase<R>::Desc::D_ON_BOTH :
         assert(rep() == ROW);
         enterPric = (*theCoPvec)[enterIdx];

         if(enterPric > SPxLPBase<R>::upper(enterIdx))
         {
            enterLB = theLCbound[enterIdx];
            enterUB = R(infinity);
            enterMax = R(infinity);
            enterVal = enterLB;
            enterRO = SPxLPBase<R>::upper(enterIdx);
            ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         }
         else
         {
            enterUB = theUCbound[enterIdx];
            enterVal = enterUB;
            enterRO = SPxLPBase<R>::lower(enterIdx);
            enterLB = R(-infinity);
            enterMax = R(-infinity);
            ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         }

         objChange -= theLCbound[enterIdx] * SPxLPBase<R>::upper(enterIdx);
         objChange -= theUCbound[enterIdx] * SPxLPBase<R>::lower(enterIdx);
         break;

      default:
         throw SPxInternalCodeException("XENTER01 This should never happen.");
      }

      SPxOut::debug(this, "DENTER03 SPxSolverBase::getEnterVals() : col {}: {} -> {} objChange: {}\n",
                    enterIdx, enterStat, ds.colStatus(enterIdx), objChange);
   }

   else
   {
      assert(enterId.isSPxRowId());
      enterIdx = this->number(SPxRowId(enterId));
      enterStat = ds.rowStatus(enterIdx);
      assert(!isBasic(enterStat));

      /*      For an #Id# to enter the basis we better recompute the Test value.
       */
      if(rep() == ROW)
      {
         computePvec(enterIdx);
         enterTest = computeTest(enterIdx);
         theTest[enterIdx] = 0;
      }
      else
      {
         enterTest = coTest()[enterIdx];
         theCoTest[enterIdx] = 0;
      }

      switch(enterStat)
      {
      // primal/columnwise cases:
      case SPxBasisBase<R>::Desc::P_ON_UPPER :
         assert(rep() == COLUMN);
         enterUB = theURbound[enterIdx];
         enterLB = theLRbound[enterIdx];
         enterVal = enterLB;
         enterMax = enterUB - enterLB;
         enterPric = (*theCoPvec)[enterIdx];
         enterRO = this->maxRowObj(enterIdx);
         objChange -= enterRO * enterVal;

         if(enterUB >= R(infinity))
            ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::D_ON_LOWER;
         else if(EQ(enterLB, enterUB, this->epsilon()))
            ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::D_FREE;
         else
            ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::D_ON_BOTH;

         break;

      case SPxBasisBase<R>::Desc::P_ON_LOWER :
         assert(rep() == COLUMN);
         enterUB = theURbound[enterIdx];
         enterLB = theLRbound[enterIdx];
         enterVal = enterUB;
         enterMax = enterLB - enterUB;
         enterPric = (*theCoPvec)[enterIdx];
         enterRO = this->maxRowObj(enterIdx);
         objChange -= enterRO * enterVal;

         if(enterLB <= R(-infinity))
            ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::D_ON_UPPER;
         else if(EQ(enterLB, enterUB, this->epsilon()))
            ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::D_FREE;
         else
            ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::D_ON_BOTH;

         break;

      case SPxBasisBase<R>::Desc::P_FREE :
         assert(rep() == COLUMN);
#if 1
         throw SPxInternalCodeException("XENTER02 This should never happen.");
#else
         SPX_MSG_ERROR(std::cerr << "EENTER99 ERROR: not yet debugged!" << std::endl;)
         enterPric = (*theCoPvec)[enterIdx];
         enterRO = this->maxRowObj(enterIdx);
         ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::D_UNDEFINED;
#endif
         break;

      // dual/rowwise cases:
      case SPxBasisBase<R>::Desc::D_ON_UPPER :
         assert(rep() == ROW);
         assert(theURbound[enterIdx] < R(infinity));
         enterUB = theURbound[enterIdx];
         enterLB = R(-infinity);
         enterVal = enterUB;
         enterMax = R(-infinity);
         enterPric = (*thePvec)[enterIdx];
         enterRO = this->lhs(enterIdx);
         objChange -= enterRO * enterVal;
         ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         break;

      case SPxBasisBase<R>::Desc::D_ON_LOWER :
         assert(rep() == ROW);
         assert(theLRbound[enterIdx] > R(-infinity));
         enterLB = theLRbound[enterIdx];
         enterUB = R(infinity);
         enterVal = enterLB;
         enterMax = R(infinity);
         enterPric = (*thePvec)[enterIdx];
         enterRO = this->rhs(enterIdx);
         objChange -= enterRO * enterVal;
         ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         break;

      case SPxBasisBase<R>::Desc::D_FREE:
         assert(rep() == ROW);
         assert(this->rhs(enterIdx) == this->lhs(enterIdx));
         enterUB = R(infinity);
         enterLB = R(-infinity);
         enterVal = 0;
         enterPric = (*thePvec)[enterIdx];
         enterRO = this->rhs(enterIdx);
         enterMax = (enterPric > enterRO) ? R(infinity) : R(-infinity);
         ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::P_FIXED;
         break;

      case SPxBasisBase<R>::Desc::D_ON_BOTH :
         assert(rep() == ROW);
         enterPric = (*thePvec)[enterIdx];

         if(enterPric > this->rhs(enterIdx))
         {
            enterLB = theLRbound[enterIdx];
            enterVal = enterLB;
            enterUB = R(infinity);
            enterMax = R(infinity);
            enterRO = this->rhs(enterIdx);
            ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         }
         else
         {
            enterUB = theURbound[enterIdx];
            enterVal = enterUB;
            enterLB = R(-infinity);
            enterMax = R(-infinity);
            enterRO = this->lhs(enterIdx);
            ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         }

         objChange -= theLRbound[enterIdx] * this->rhs(enterIdx);
         objChange -= theURbound[enterIdx] * this->lhs(enterIdx);
         break;

      default:
         throw SPxInternalCodeException("XENTER03 This should never happen.");
      }

      SPxOut::debug(this, "DENTER05 SPxSolverBase::getEnterVals() : row {}: {} -> {} objChange: {}\n",
                    enterIdx, enterStat, ds.rowStatus(enterIdx), objChange);
   }
}